

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O1

QHash<int,_QByteArray> __thiscall
QConcatenateTablesProxyModel::roleNames(QConcatenateTablesProxyModel *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  QHash<QByteArray,_QTzTimeZone> *other;
  long lVar5;
  long in_RSI;
  long in_FS_OFFSET;
  QHash<int,_QByteArray> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(in_RSI + 8);
  if ((*(byte *)(lVar1 + 0x104) & 1) != 0) {
    other = QAbstractItemModelPrivate::defaultRoleNames();
    QHash<int,_QByteArray>::operator=
              ((QHash<int,_QByteArray> *)(lVar1 + 0xf0),(QHash<int,_QByteArray> *)other);
    lVar2 = *(long *)(lVar1 + 0xe8);
    if (lVar2 != 0) {
      lVar3 = *(long *)(lVar1 + 0xe0);
      lVar5 = 0;
      do {
        (**(code **)(**(long **)(lVar3 + lVar5) + 0x160))(&local_40);
        QHash<int,_QByteArray>::insert((QHash<int,_QByteArray> *)(lVar1 + 0xf0),&local_40);
        QHash<int,_QByteArray>::~QHash(&local_40);
        lVar5 = lVar5 + 0x90;
      } while (lVar2 * 0x90 != lVar5);
    }
    *(byte *)(lVar1 + 0x104) = *(byte *)(lVar1 + 0x104) & 0xfe;
  }
  piVar4 = *(int **)(lVar1 + 0xf0);
  *(int **)this = piVar4;
  if ((piVar4 != (int *)0x0) && (*piVar4 != -1)) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QHash<int,_QByteArray>)(Data *)this;
  }
  __stack_chk_fail();
}

Assistant:

QHash<int, QByteArray> QConcatenateTablesProxyModel::roleNames() const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (d->m_roleNamesDirty) {
        d->m_roleNames = QAbstractItemModelPrivate::defaultRoleNames();
        for (const auto &[model, _] : d->m_models)
            d->m_roleNames.insert(model->roleNames());
        d->m_roleNamesDirty = false;
    }
    return d->m_roleNames;
}